

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapTest.cpp
# Opt level: O2

void print<ft::map<int,int,ft::greater<int>,ft::allocator<ft::pair<int_const,int>>>>
               (map<int,_int,_ft::greater<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *t,
               char *s)

{
  ostream *poVar1;
  treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  local_48;
  
  local_48._vptr_treeIterator = (_func_int **)&PTR__treeIterator_00113cd8;
  *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 3;
  poVar1 = std::operator<<((ostream *)&std::cout,s);
  std::operator<<(poVar1," contains:");
  local_48.m_tree =
       &(t->super_mapBase<int,_int,_ft::greater<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
        super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::greater<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
        .m_tree;
  local_48.m_node =
       ((t->super_mapBase<int,_int,_ft::greater<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
        super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::greater<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
        .m_tree.m_first)->parent;
  while (local_48.m_node !=
         (t->super_mapBase<int,_int,_ft::greater<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
         super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::greater<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
         .m_tree.m_last) {
    poVar1 = std::operator<<((ostream *)&std::cout," (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,((local_48.m_node)->value).first);
    poVar1 = std::operator<<(poVar1," => ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,((local_48.m_node)->value).second);
    std::operator<<(poVar1,')');
    ft::
    treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
    ::operator++(&local_48);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void	print(T const & t, char const * s)
{
	typename T::const_iterator	it;

	std::cout << std::setw(3) << s << " contains:";
	for (it = t.begin(); it != t.end(); ++it)
		std::cout << " (" << it->first << " => " << it->second << ')';
	std::cout << std::endl;
}